

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O2

void BrotliBuildAndStoreHuffmanTreeFast
               (MemoryManager *m,uint32_t *histogram,size_t histogram_total,size_t max_bits,
               uint8_t *depth,uint16_t *bits,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  HuffmanTree HVar4;
  int iVar5;
  HuffmanTree *pool;
  HuffmanTree *pHVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  byte bVar14;
  uint *puVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  HuffmanTree *pHVar19;
  HuffmanTree *pHVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  size_t sVar24;
  ulong uVar25;
  bool bVar26;
  size_t symbols [4];
  
  symbols[2] = 0;
  symbols[3] = 0;
  symbols[0] = 0;
  symbols[1] = 0;
  sVar24 = 8;
  uVar25 = 0;
  uVar23 = 0;
  while (histogram_total != 0) {
    uVar16 = histogram[uVar25];
    if ((ulong)uVar16 != 0) {
      if (uVar23 < 4) {
        symbols[uVar23] = uVar25;
      }
      uVar23 = uVar23 + 1;
      histogram_total = histogram_total - uVar16;
    }
    uVar25 = uVar25 + 1;
    sVar24 = sVar24 + 0x10;
  }
  if (uVar23 < 2) {
    uVar25 = *storage_ix;
    uVar23 = uVar25 + 4;
    *(ulong *)(storage + (uVar25 >> 3)) = (ulong)storage[uVar25 >> 3] | 1L << ((byte)uVar25 & 7);
    *storage_ix = uVar23;
    *(size_t *)(storage + (uVar23 >> 3)) =
         symbols[0] << ((byte)uVar23 & 7) | (ulong)storage[uVar23 >> 3];
    *storage_ix = uVar25 + max_bits + 4;
    depth[symbols[0]] = '\0';
    bits[symbols[0]] = 0;
    return;
  }
  memset(depth,0,uVar25);
  pool = (HuffmanTree *)BrotliAllocate(m,sVar24);
  uVar16 = 1;
  pHVar6 = pool;
  uVar7 = uVar25;
LAB_00111d8c:
  do {
    puVar15 = histogram + (uVar7 - 1);
    uVar9 = 0;
    while (uVar7 != uVar9) {
      uVar11 = *puVar15;
      uVar9 = uVar9 + 1;
      puVar15 = puVar15 + -1;
      if (uVar11 != 0) goto code_r0x00111da4;
    }
    uVar7 = (ulong)((long)pHVar6 - (long)pool) >> 3;
    iVar5 = (int)uVar7;
    uVar9 = (ulong)iVar5;
    if (uVar9 < 0xd) {
      for (uVar13 = 1; uVar13 < uVar9; uVar13 = uVar13 + 1) {
        HVar4 = pool[uVar13];
        uVar18 = uVar13;
        do {
          if (pool[uVar18 - 1].total_count_ <= HVar4.total_count_) goto LAB_00111e12;
          pool[uVar18] = pool[uVar18 - 1];
          uVar18 = uVar18 - 1;
        } while (uVar18 != 0);
        uVar18 = 0;
LAB_00111e12:
        pool[uVar18] = HVar4;
      }
    }
    else {
      for (uVar13 = (ulong)((uint)(uVar9 < 0x39) * 2); uVar13 != 6; uVar13 = uVar13 + 1) {
        uVar18 = *(ulong *)(SortHuffmanTreeItems_gaps + uVar13 * 8);
        pHVar19 = pool + uVar18;
        pHVar20 = pool;
        for (uVar22 = uVar18; uVar22 < uVar9; uVar22 = uVar22 + 1) {
          HVar4 = pool[uVar22];
          for (lVar10 = 0;
              (uVar18 <= uVar22 + lVar10 && (HVar4.total_count_ < pHVar20[lVar10].total_count_));
              lVar10 = lVar10 - uVar18) {
            pHVar19[lVar10] = pHVar20[lVar10];
          }
          pHVar19[lVar10] = HVar4;
          pHVar19 = pHVar19 + 1;
          pHVar20 = pHVar20 + 1;
        }
      }
    }
    iVar8 = iVar5 + 1;
    pHVar6->total_count_ = 0xffffffff;
    pHVar6->index_left_ = -1;
    pHVar6->index_right_or_value_ = -1;
    pHVar6[1].total_count_ = 0xffffffff;
    pHVar6[1].index_left_ = -1;
    pHVar6[1].index_right_or_value_ = -1;
    pHVar6 = pHVar6 + 2;
    iVar12 = 0;
    for (uVar7 = uVar7 & 0xffffffff; 1 < (int)uVar7; uVar7 = (ulong)((int)uVar7 - 1)) {
      uVar3 = pool[iVar12].total_count_;
      uVar11 = pool[iVar8].total_count_;
      iVar17 = iVar12;
      if (uVar11 < uVar3) {
        iVar17 = iVar8;
      }
      iVar12 = iVar12 + (uint)(uVar3 <= uVar11);
      iVar8 = iVar8 + (uint)(uVar11 < uVar3);
      uVar3 = pool[iVar12].total_count_;
      uVar11 = pool[iVar8].total_count_;
      iVar21 = iVar12;
      if (uVar11 < uVar3) {
        iVar21 = iVar8;
      }
      iVar12 = iVar12 + (uint)(uVar3 <= uVar11);
      iVar8 = iVar8 + (uint)(uVar11 < uVar3);
      pHVar6[-1].total_count_ = pool[iVar21].total_count_ + pool[iVar17].total_count_;
      pHVar6[-1].index_left_ = (int16_t)iVar17;
      pHVar6[-1].index_right_or_value_ = (int16_t)iVar21;
      pHVar6->total_count_ = 0xffffffff;
      pHVar6->index_left_ = -1;
      pHVar6->index_right_or_value_ = -1;
      pHVar6 = pHVar6 + 1;
    }
    iVar5 = BrotliSetDepth(iVar5 * 2 + -1,pool,depth,0xe);
    uVar16 = uVar16 * 2;
    pHVar6 = pool;
    uVar7 = uVar25;
  } while (iVar5 == 0);
  BrotliFree(m,pool);
  BrotliConvertBitDepthsToSymbols(depth,uVar25,bits);
  if (uVar23 < 5) {
    uVar7 = *storage_ix;
    *(ulong *)(storage + (uVar7 >> 3)) = (ulong)storage[uVar7 >> 3] | 1L << ((byte)uVar7 & 7);
    uVar25 = uVar7 + 2;
    *storage_ix = uVar25;
    *(ulong *)(storage + (uVar25 >> 3)) =
         uVar23 - 1 << ((byte)uVar25 & 7) | (ulong)storage[uVar25 >> 3];
    uVar7 = uVar7 + 4;
    *storage_ix = uVar7;
    uVar25 = 0;
    while (uVar9 = uVar25, uVar9 != uVar23) {
      for (uVar13 = uVar9 + 1; uVar25 = uVar9 + 1, uVar13 < uVar23; uVar13 = uVar13 + 1) {
        sVar24 = symbols[uVar13];
        if (depth[sVar24] < depth[symbols[uVar9]]) {
          symbols[uVar13] = symbols[uVar9];
          symbols[uVar9] = sVar24;
        }
      }
    }
    uVar18 = symbols[0] << ((byte)uVar7 & 7);
    uVar13 = uVar7 >> 3;
    uVar7 = uVar7 + max_bits;
    uVar9 = uVar7 >> 3;
    bVar14 = (byte)uVar7;
    uVar25 = uVar7 + max_bits;
    if (uVar23 != 3) {
      if (uVar23 == 2) {
        *(ulong *)(storage + uVar13) = uVar18 | storage[uVar13];
        *storage_ix = uVar7;
        *(size_t *)(storage + uVar9) = symbols[1] << (bVar14 & 7) | (ulong)storage[uVar9];
      }
      else {
        *(ulong *)(storage + uVar13) = uVar18 | storage[uVar13];
        *storage_ix = uVar7;
        *(size_t *)(storage + uVar9) = symbols[1] << (bVar14 & 7) | (ulong)storage[uVar9];
        *storage_ix = uVar25;
        *(size_t *)(storage + (uVar25 >> 3)) =
             symbols[2] << ((byte)uVar25 & 7) | (ulong)storage[uVar25 >> 3];
        uVar25 = uVar25 + max_bits;
        *storage_ix = uVar25;
        *(size_t *)(storage + (uVar25 >> 3)) =
             symbols[3] << ((byte)uVar25 & 7) | (ulong)storage[uVar25 >> 3];
        uVar23 = uVar25 + max_bits;
        *storage_ix = uVar23;
        *(ulong *)(storage + (uVar23 >> 3)) =
             (ulong)(depth[symbols[0]] == '\x01') << ((byte)uVar23 & 7) |
             (ulong)storage[uVar23 >> 3];
        uVar25 = uVar25 + max_bits + 1;
      }
      *storage_ix = uVar25;
      return;
    }
    *(ulong *)(storage + uVar13) = uVar18 | storage[uVar13];
    *storage_ix = uVar7;
    *(size_t *)(storage + uVar9) = symbols[1] << (bVar14 & 7) | (ulong)storage[uVar9];
    *storage_ix = uVar25;
    *(size_t *)(storage + (uVar25 >> 3)) =
         symbols[2] << ((byte)uVar25 & 7) | (ulong)storage[uVar25 >> 3];
    *storage_ix = max_bits + uVar25;
    return;
  }
  uVar23 = *storage_ix;
  *(ulong *)(storage + (uVar23 >> 3)) =
       0xff55555554 << ((byte)uVar23 & 7) | (ulong)storage[uVar23 >> 3];
  uVar23 = uVar23 + 0x28;
  uVar7 = 0;
  bVar14 = 8;
LAB_00112062:
  do {
    *storage_ix = uVar23;
    while( true ) {
      if (uVar25 <= uVar7) {
        return;
      }
      bVar1 = depth[uVar7];
      for (uVar9 = 1;
          (uVar13 = uVar25 - uVar7, uVar7 + uVar9 < uVar25 &&
          (uVar13 = uVar9, depth[uVar9 + uVar7] == bVar1)); uVar9 = uVar9 + 1) {
      }
      uVar7 = uVar7 + uVar13;
      if (bVar1 == 0) {
        uVar16 = kZeroRepsDepth[uVar13];
        *(uint64_t *)(storage + (uVar23 >> 3)) =
             kZeroRepsBits[uVar13] << ((byte)uVar23 & 7) | (ulong)storage[uVar23 >> 3];
        uVar23 = uVar23 + uVar16;
        goto LAB_00112062;
      }
      if (bVar14 != bVar1) {
        bVar14 = "\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x05\x05"[bVar1];
        *(ulong *)(storage + (uVar23 >> 3)) =
             (ulong)kCodeLengthBits[bVar1] << ((byte)uVar23 & 7) | (ulong)storage[uVar23 >> 3];
        uVar23 = uVar23 + bVar14;
        *storage_ix = uVar23;
        uVar13 = uVar13 - 1;
      }
      bVar14 = bVar1;
      if (2 < uVar13) break;
      while (bVar26 = uVar13 != 0, uVar13 = uVar13 - 1, bVar26) {
        bVar2 = "\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x05\x05"[bVar1];
        *(ulong *)(storage + (uVar23 >> 3)) =
             (ulong)kCodeLengthBits[bVar1] << ((byte)uVar23 & 7) | (ulong)storage[uVar23 >> 3];
        uVar23 = uVar23 + bVar2;
        *storage_ix = uVar23;
      }
    }
    uVar16 = kCodeLengthBits[uVar13 + 0x11];
    *(ulong *)(storage + (uVar23 >> 3)) =
         *(long *)(kNonZeroRepsDepth + uVar13 * 2 + 0x2ba) << ((byte)uVar23 & 7) |
         (ulong)storage[uVar23 >> 3];
    uVar23 = uVar23 + uVar16;
  } while( true );
code_r0x00111da4:
  if (uVar11 < uVar16) {
    uVar11 = uVar16;
  }
  pHVar6->total_count_ = uVar11;
  pHVar6->index_left_ = -1;
  pHVar6->index_right_or_value_ = (short)uVar7 - (short)uVar9;
  pHVar6 = pHVar6 + 1;
  uVar7 = uVar7 - uVar9;
  goto LAB_00111d8c;
}

Assistant:

void BrotliBuildAndStoreHuffmanTreeFast(MemoryManager* m,
                                        const uint32_t* histogram,
                                        const size_t histogram_total,
                                        const size_t max_bits,
                                        uint8_t* depth, uint16_t* bits,
                                        size_t* storage_ix,
                                        uint8_t* storage) {
  size_t count = 0;
  size_t symbols[4] = { 0 };
  size_t length = 0;
  size_t total = histogram_total;
  while (total != 0) {
    if (histogram[length]) {
      if (count < 4) {
        symbols[count] = length;
      }
      ++count;
      total -= histogram[length];
    }
    ++length;
  }

  if (count <= 1) {
    BrotliWriteBits(4, 1, storage_ix, storage);
    BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
    depth[symbols[0]] = 0;
    bits[symbols[0]] = 0;
    return;
  }

  memset(depth, 0, length * sizeof(depth[0]));
  {
    const size_t max_tree_size = 2 * length + 1;
    HuffmanTree* tree = BROTLI_ALLOC(m, HuffmanTree, max_tree_size);
    uint32_t count_limit;
    if (BROTLI_IS_OOM(m)) return;
    for (count_limit = 1; ; count_limit *= 2) {
      HuffmanTree* node = tree;
      size_t l;
      for (l = length; l != 0;) {
        --l;
        if (histogram[l]) {
          if (BROTLI_PREDICT_TRUE(histogram[l] >= count_limit)) {
            InitHuffmanTree(node, histogram[l], -1, (int16_t)l);
          } else {
            InitHuffmanTree(node, count_limit, -1, (int16_t)l);
          }
          ++node;
        }
      }
      {
        const int n = (int)(node - tree);
        HuffmanTree sentinel;
        int i = 0;      /* Points to the next leaf node. */
        int j = n + 1;  /* Points to the next non-leaf node. */
        int k;

        SortHuffmanTreeItems(tree, (size_t)n, SortHuffmanTree);
        /* The nodes are:
           [0, n): the sorted leaf nodes that we start with.
           [n]: we add a sentinel here.
           [n + 1, 2n): new parent nodes are added here, starting from
                        (n+1). These are naturally in ascending order.
           [2n]: we add a sentinel at the end as well.
           There will be (2n+1) elements at the end. */
        InitHuffmanTree(&sentinel, BROTLI_UINT32_MAX, -1, -1);
        *node++ = sentinel;
        *node++ = sentinel;

        for (k = n - 1; k > 0; --k) {
          int left, right;
          if (tree[i].total_count_ <= tree[j].total_count_) {
            left = i;
            ++i;
          } else {
            left = j;
            ++j;
          }
          if (tree[i].total_count_ <= tree[j].total_count_) {
            right = i;
            ++i;
          } else {
            right = j;
            ++j;
          }
          /* The sentinel node becomes the parent node. */
          node[-1].total_count_ =
              tree[left].total_count_ + tree[right].total_count_;
          node[-1].index_left_ = (int16_t)left;
          node[-1].index_right_or_value_ = (int16_t)right;
          /* Add back the last sentinel node. */
          *node++ = sentinel;
        }
        if (BrotliSetDepth(2 * n - 1, tree, depth, 14)) {
          /* We need to pack the Huffman tree in 14 bits. If this was not
             successful, add fake entities to the lowest values and retry. */
          break;
        }
      }
    }
    BROTLI_FREE(m, tree);
  }
  BrotliConvertBitDepthsToSymbols(depth, length, bits);
  if (count <= 4) {
    size_t i;
    /* value of 1 indicates a simple Huffman code */
    BrotliWriteBits(2, 1, storage_ix, storage);
    BrotliWriteBits(2, count - 1, storage_ix, storage);  /* NSYM - 1 */

    /* Sort */
    for (i = 0; i < count; i++) {
      size_t j;
      for (j = i + 1; j < count; j++) {
        if (depth[symbols[j]] < depth[symbols[i]]) {
          BROTLI_SWAP(size_t, symbols, j, i);
        }
      }
    }

    if (count == 2) {
      BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[1], storage_ix, storage);
    } else if (count == 3) {
      BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[1], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[2], storage_ix, storage);
    } else {
      BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[1], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[2], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[3], storage_ix, storage);
      /* tree-select */
      BrotliWriteBits(1, depth[symbols[0]] == 1 ? 1 : 0, storage_ix, storage);
    }
  } else {
    uint8_t previous_value = 8;
    size_t i;
    /* Complex Huffman Tree */
    StoreStaticCodeLengthCode(storage_ix, storage);

    /* Actual RLE coding. */
    for (i = 0; i < length;) {
      const uint8_t value = depth[i];
      size_t reps = 1;
      size_t k;
      for (k = i + 1; k < length && depth[k] == value; ++k) {
        ++reps;
      }
      i += reps;
      if (value == 0) {
        BrotliWriteBits(kZeroRepsDepth[reps], kZeroRepsBits[reps],
                        storage_ix, storage);
      } else {
        if (previous_value != value) {
          BrotliWriteBits(kCodeLengthDepth[value], kCodeLengthBits[value],
                          storage_ix, storage);
          --reps;
        }
        if (reps < 3) {
          while (reps != 0) {
            reps--;
            BrotliWriteBits(kCodeLengthDepth[value], kCodeLengthBits[value],
                            storage_ix, storage);
          }
        } else {
          reps -= 3;
          BrotliWriteBits(kNonZeroRepsDepth[reps], kNonZeroRepsBits[reps],
                          storage_ix, storage);
        }
        previous_value = value;
      }
    }
  }
}